

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_alsa.c
# Opt level: O2

void alsa_set_stream_state(cubeb_stream_conflict1 *stm,stream_state state)

{
  cubeb_conflict1 *ctx;
  
  ctx = stm->context;
  stm->state = state;
  pthread_cond_broadcast((pthread_cond_t *)&stm->cond);
  ctx->rebuild = 1;
  poll_wake(ctx);
  return;
}

Assistant:

static void
alsa_set_stream_state(cubeb_stream * stm, enum stream_state state)
{
  cubeb * ctx;
  int r;

  ctx = stm->context;
  stm->state = state;
  r = pthread_cond_broadcast(&stm->cond);
  assert(r == 0);
  ctx->rebuild = 1;
  poll_wake(ctx);
}